

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::tools::OpenSSLClient::OpenSSLErrAsString_abi_cxx11_
          (string *__return_storage_ptr__,OpenSSLClient *this)

{
  ulong uVar1;
  size_t sVar2;
  BIO_METHOD *type;
  allocator local_31;
  ulong local_30;
  size_t len;
  char *buf;
  BIO *bio;
  OpenSSLClient *this_local;
  
  bio = (BIO *)this;
  this_local = (OpenSSLClient *)__return_storage_ptr__;
  type = BIO_s_mem();
  buf = (char *)BIO_new(type);
  ERR_print_errors((BIO *)buf);
  len = 0;
  local_30 = BIO_ctrl((BIO *)buf,3,0,&len);
  BIO_free((BIO *)buf);
  sVar2 = len;
  uVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)sVar2,uVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenSSLClient::OpenSSLErrAsString ()
{
    BIO *bio = BIO_new (BIO_s_mem ());
    ERR_print_errors (bio);
    char *buf = nullptr;
    size_t len = BIO_get_mem_data (bio, &buf);
    BIO_free (bio);
    return std::string(buf, len);
}